

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

bool __thiscall
JsUtil::ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer> *this,
          JITJavascriptString **item)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    iVar1 = this->count;
    if (iVar1 <= lVar4) break;
    bVar3 = Js::JavascriptStringHelpers<JITJavascriptString>::Equals(*item,this->buffer[lVar4]);
    lVar2 = lVar4 + 1;
  } while (!bVar3);
  return lVar4 < iVar1;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }